

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O0

void test_chunk(Chunk *ch)

{
  bool bVar1;
  __type _Var2;
  uint32_t uVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  char *pcVar7;
  array<char,_4UL> local_21c;
  array<char,_4UL> local_218;
  array<char,_4UL> local_214;
  Chunk local_210;
  Chunk second2;
  Chunk first2;
  iterator first_it2;
  array<char,_4UL> local_1f0;
  array<char,_4UL> local_1ec;
  Chunk local_1e8;
  Chunk second;
  Chunk local_1d8;
  Chunk first;
  iterator first_it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  array<char,_4UL> local_19d;
  allocator<riffcpp::Chunk> local_199;
  Chunk local_198;
  Chunk local_190;
  undefined1 local_188 [8];
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> subchunks_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  array<char,_4UL> local_145;
  allocator local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  array<char,_4UL> local_11d;
  allocator<riffcpp::Chunk> local_119;
  Chunk local_118;
  Chunk local_110;
  undefined1 local_108 [8];
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> subchunks_1;
  array<char,_4UL> local_e5;
  allocator<riffcpp::Chunk> local_e1;
  Chunk local_e0;
  Chunk local_d8;
  undefined1 local_d0 [8];
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  undefined1 local_b0 [8];
  vector<char,_std::allocator<char>_> buffer;
  undefined1 local_90 [8];
  string str3;
  undefined1 local_68 [8];
  string str2;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string str1;
  Chunk *ch_local;
  
  str1.field_2._8_8_ = ch;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"hey this is a test",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"hey this is another test",
             (allocator<char> *)(str3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(str3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"final test",
             (allocator<char> *)
             &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_b0);
  chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = riffcpp::Chunk::id((Chunk *)str1.field_2._8_8_);
  bVar1 = std::operator==((array<char,_4UL> *)
                          ((long)&chunks.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          (array<char,_4UL> *)&riffcpp::riff_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,10);
    poVar4 = std::operator<<(poVar4,": ch.id() == riffcpp::riff_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Toplevel \'RIFF\' id expected");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,10);
  std::operator<<(poVar4,"): OK\n");
  chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       riffcpp::Chunk::type((Chunk *)str1.field_2._8_8_);
  bVar1 = std::operator==((array<char,_4UL> *)
                          &chunks.
                           super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,&smpl_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb);
    poVar4 = std::operator<<(poVar4,": ch.type() == smpl_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Expected \'smpl\' chunk");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ch.type() == smpl_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb);
  std::operator<<(poVar4,"): OK\n");
  riffcpp::Chunk::begin(&local_d8,SUB81(str1.field_2._8_8_,0));
  riffcpp::Chunk::end(&local_e0);
  std::allocator<riffcpp::Chunk>::allocator(&local_e1);
  std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::vector<riffcpp::Chunk::iterator,void>
            ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)local_d0,(iterator *)&local_d8
             ,(iterator *)&local_e0,&local_e1);
  std::allocator<riffcpp::Chunk>::~allocator(&local_e1);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_e0);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_d8);
  sVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::size
                    ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0);
  if (sVar5 != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xd);
    poVar4 = std::operator<<(poVar4,": chunks.size() == 2\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Toplevel chunk must contain two subchunks");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"chunks.size() == 2 (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xd);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0,0);
  local_e5._M_elems = (_Type)riffcpp::Chunk::id(pvVar6);
  bVar1 = std::operator==(&local_e5,(array<char,_4UL> *)&riffcpp::list_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x10);
    poVar4 = std::operator<<(poVar4,": chunks[0].id() == riffcpp::list_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'LIST\' id");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"chunks[0].id() == riffcpp::list_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x10);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0,0);
  register0x00000000 = riffcpp::Chunk::type(pvVar6);
  bVar1 = std::operator==((array<char,_4UL> *)
                          ((long)&subchunks_1.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&tst1_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11);
    poVar4 = std::operator<<(poVar4,": chunks[0].type() == tst1_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'tst1\' type");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"chunks[0].type() == tst1_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0,0);
  riffcpp::Chunk::begin(&local_110,SUB81(pvVar6,0));
  std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
            ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0,0);
  riffcpp::Chunk::end(&local_118);
  std::allocator<riffcpp::Chunk>::allocator(&local_119);
  std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::vector<riffcpp::Chunk::iterator,void>
            ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)local_108,
             (iterator *)&local_110,(iterator *)&local_118,&local_119);
  std::allocator<riffcpp::Chunk>::~allocator(&local_119);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_118);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_110);
  sVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::size
                    ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108);
  if (sVar5 != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x13);
    poVar4 = std::operator<<(poVar4,": subchunks_1.size() == 2\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have two subchunks");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"subchunks_1.size() == 2 (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x13);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108,0);
  local_11d._M_elems = (_Type)riffcpp::Chunk::id(pvVar6);
  bVar1 = std::operator==(&local_11d,&test_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x14);
    poVar4 = std::operator<<(poVar4,": subchunks_1[0].id() == test_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'test\' id");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"subchunks_1[0].id() == test_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x14);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108,0);
  uVar3 = riffcpp::Chunk::size(pvVar6);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_b0,(ulong)uVar3);
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108,0);
  pcVar7 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_b0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_b0);
  riffcpp::Chunk::read_data(pvVar6,pcVar7,sVar5);
  pcVar7 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_b0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,pcVar7,sVar5,&local_141);
  _Var2 = std::operator==(&local_140,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  if (((_Var2 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x18);
    poVar4 = std::operator<<(poVar4,": std::string(buffer.data(), buffer.size()) == str1\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Strings must be equal");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "std::string(buffer.data(), buffer.size()) == str1 (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x18);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108,1);
  local_145._M_elems = (_Type)riffcpp::Chunk::id(pvVar6);
  bVar1 = std::operator==(&local_145,&test_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x19);
    poVar4 = std::operator<<(poVar4,": subchunks_1[1].id() == test_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'test\' id");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"subchunks_1[1].id() == test_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x19);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108,1);
  uVar3 = riffcpp::Chunk::size(pvVar6);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_b0,(ulong)uVar3);
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108,1);
  pcVar7 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_b0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_b0);
  riffcpp::Chunk::read_data(pvVar6,pcVar7,sVar5);
  pcVar7 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_b0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,pcVar7,sVar5,
             (allocator *)
             ((long)&subchunks_2.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  _Var2 = std::operator==(&local_168,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&subchunks_2.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (((_Var2 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
    poVar4 = std::operator<<(poVar4,": std::string(buffer.data(), buffer.size()) == str2\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Strings must be equal");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "std::string(buffer.data(), buffer.size()) == str2 (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0,1);
  subchunks_2.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_4_ = riffcpp::Chunk::id(pvVar6);
  bVar1 = std::operator==((array<char,_4UL> *)
                          ((long)&subchunks_2.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 3),&seqt_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1f);
    poVar4 = std::operator<<(poVar4,": chunks[1].id() == seqt_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'seqt\' id");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"chunks[1].id() == seqt_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1f);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0,1);
  riffcpp::Chunk::begin(&local_190,SUB81(pvVar6,0));
  std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
            ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0,1);
  riffcpp::Chunk::end(&local_198);
  std::allocator<riffcpp::Chunk>::allocator(&local_199);
  std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::vector<riffcpp::Chunk::iterator,void>
            ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)local_188,
             (iterator *)&local_190,(iterator *)&local_198,&local_199);
  std::allocator<riffcpp::Chunk>::~allocator(&local_199);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_198);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_190);
  sVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::size
                    ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_188);
  if (sVar5 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x22);
    poVar4 = std::operator<<(poVar4,": subchunks_2.size() == 1\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have one subchunk");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"subchunks_2.size() == 1 (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x22);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_188,0);
  local_19d._M_elems = (_Type)riffcpp::Chunk::id(pvVar6);
  bVar1 = std::operator==(&local_19d,&test_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x23);
    poVar4 = std::operator<<(poVar4,": subchunks_2[0].id() == test_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'test\' id");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"subchunks_2[0].id() == test_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x23);
  std::operator<<(poVar4,"): OK\n");
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_188,0);
  uVar3 = riffcpp::Chunk::size(pvVar6);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_b0,(ulong)uVar3);
  pvVar6 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_188,0);
  pcVar7 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_b0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_b0);
  riffcpp::Chunk::read_data(pvVar6,pcVar7,sVar5);
  pcVar7 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_b0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,pcVar7,sVar5,(allocator *)((long)&first_it.pimpl + 7));
  _Var2 = std::operator==(&local_1c0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&first_it.pimpl + 7));
  if (((_Var2 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x27);
    poVar4 = std::operator<<(poVar4,": std::string(buffer.data(), buffer.size()) == str3\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Strings must be equal");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "std::string(buffer.data(), buffer.size()) == str3 (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x27);
  std::operator<<(poVar4,"): OK\n");
  riffcpp::Chunk::begin(&first,SUB81(str1.field_2._8_8_,0));
  riffcpp::Chunk::iterator::operator++((iterator *)&second,(int)&first);
  riffcpp::Chunk::iterator::operator*((iterator *)&local_1d8);
  riffcpp::Chunk::iterator::~iterator((iterator *)&second);
  riffcpp::Chunk::iterator::operator*((iterator *)&local_1e8);
  local_1ec._M_elems = (_Type)riffcpp::Chunk::id(&local_1d8);
  bVar1 = std::operator==(&local_1ec,(array<char,_4UL> *)&riffcpp::list_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2e);
    poVar4 = std::operator<<(poVar4,": first.id() == riffcpp::list_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'LIST\' id");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"first.id() == riffcpp::list_id (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2e);
  std::operator<<(poVar4,"): OK\n");
  local_1f0._M_elems = (_Type)riffcpp::Chunk::type(&local_1d8);
  bVar1 = std::operator==(&local_1f0,&tst1_id);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"first.type() == tst1_id (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2f);
    std::operator<<(poVar4,"): OK\n");
    first_it2.pimpl._4_4_ = riffcpp::Chunk::id(&local_1e8);
    bVar1 = std::operator==((array<char,_4UL> *)((long)&first_it2.pimpl + 4),&seqt_id);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
      poVar4 = std::operator<<(poVar4,": second.id() == seqt_id\n");
      poVar4 = std::operator<<(poVar4,"Reason: ");
      poVar4 = std::operator<<(poVar4,"Subchunk must have \'seqt\' id");
      std::operator<<(poVar4,'\n');
      exit(1);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"second.id() == seqt_id (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
    std::operator<<(poVar4,"): OK\n");
    riffcpp::Chunk::begin(&first2,SUB81(str1.field_2._8_8_,0));
    riffcpp::Chunk::iterator::operator*((iterator *)&second2);
    riffcpp::Chunk::iterator::operator++((iterator *)&first2);
    riffcpp::Chunk::iterator::operator*((iterator *)&local_210);
    local_214._M_elems = (_Type)riffcpp::Chunk::id(&second2);
    bVar1 = std::operator==(&local_214,(array<char,_4UL> *)&riffcpp::list_id);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x37);
      poVar4 = std::operator<<(poVar4,": first2.id() == riffcpp::list_id\n");
      poVar4 = std::operator<<(poVar4,"Reason: ");
      poVar4 = std::operator<<(poVar4,"Subchunk must have \'LIST\' id");
      std::operator<<(poVar4,'\n');
      exit(1);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"first2.id() == riffcpp::list_id (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x37);
    std::operator<<(poVar4,"): OK\n");
    local_218._M_elems = (_Type)riffcpp::Chunk::type(&second2);
    bVar1 = std::operator==(&local_218,&tst1_id);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x38);
      poVar4 = std::operator<<(poVar4,": first2.type() == tst1_id\n");
      poVar4 = std::operator<<(poVar4,"Reason: ");
      poVar4 = std::operator<<(poVar4,"Subchunk must have \'LIST\' id");
      std::operator<<(poVar4,'\n');
      exit(1);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"first2.type() == tst1_id (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x38);
    std::operator<<(poVar4,"): OK\n");
    local_21c._M_elems = (_Type)riffcpp::Chunk::id(&local_210);
    bVar1 = std::operator==(&local_21c,&seqt_id);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"second2.id() == seqt_id (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x39);
      std::operator<<(poVar4,"): OK\n");
      riffcpp::Chunk::~Chunk(&local_210);
      riffcpp::Chunk::~Chunk(&second2);
      riffcpp::Chunk::iterator::~iterator((iterator *)&first2);
      riffcpp::Chunk::~Chunk(&local_1e8);
      riffcpp::Chunk::~Chunk(&local_1d8);
      riffcpp::Chunk::iterator::~iterator((iterator *)&first);
      std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector
                ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_188);
      std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector
                ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_108);
      std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector
                ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_d0);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_b0);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)local_30);
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x39);
    poVar4 = std::operator<<(poVar4,": second2.id() == seqt_id\n");
    poVar4 = std::operator<<(poVar4,"Reason: ");
    poVar4 = std::operator<<(poVar4,"Subchunk must have \'seqt\' id");
    std::operator<<(poVar4,'\n');
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2f);
  poVar4 = std::operator<<(poVar4,": first.type() == tst1_id\n");
  poVar4 = std::operator<<(poVar4,"Reason: ");
  poVar4 = std::operator<<(poVar4,"Subchunk must have \'LIST\' id");
  std::operator<<(poVar4,'\n');
  exit(1);
}

Assistant:

void test_chunk(riffcpp::Chunk &ch) {
  std::string str1("hey this is a test"), str2("hey this is another test"),
   str3("final test");

  std::vector<char> buffer;

  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks{ch.begin(), ch.end()};
  TEST_ASSERT(chunks.size() == 2, "Toplevel chunk must contain two subchunks");

  TEST_ASSERT(chunks[0].id() == riffcpp::list_id,
              "Subchunk must have 'LIST' id");
  TEST_ASSERT(chunks[0].type() == tst1_id, "Subchunk must have 'tst1' type");
  std::vector<riffcpp::Chunk> subchunks_1{chunks[0].begin(), chunks[0].end()};
  TEST_ASSERT(subchunks_1.size() == 2, "Subchunk must have two subchunks");
  TEST_ASSERT(subchunks_1[0].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_1[0].size());
  subchunks_1[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str1,
              "Strings must be equal");
  TEST_ASSERT(subchunks_1[1].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_1[1].size());
  subchunks_1[1].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str2,
              "Strings must be equal");

  TEST_ASSERT(chunks[1].id() == seqt_id, "Subchunk must have 'seqt' id");
  std::vector<riffcpp::Chunk> subchunks_2{chunks[1].begin(true),
                                          chunks[1].end()};
  TEST_ASSERT(subchunks_2.size() == 1, "Subchunk must have one subchunk");
  TEST_ASSERT(subchunks_2[0].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_2[0].size());
  subchunks_2[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str3,
              "Strings must be equal");

  // Test prefix and postfix increment operators
  auto first_it = ch.begin();
  auto first = *(first_it++);
  auto second = *first_it;

  TEST_ASSERT(first.id() == riffcpp::list_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(first.type() == tst1_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(second.id() == seqt_id, "Subchunk must have 'seqt' id");

  auto first_it2 = ch.begin();
  auto first2 = *first_it2;
  ++first_it2;
  auto second2 = *first_it2;

  TEST_ASSERT(first2.id() == riffcpp::list_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(first2.type() == tst1_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(second2.id() == seqt_id, "Subchunk must have 'seqt' id");
}